

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

string * __thiscall
rcg::(anonymous_namespace)::cDevGetInfo_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Device *obj,
          shared_ptr<const_rcg::GenTLWrapper> *gentl,DEVICE_INFO_CMD info)

{
  Interface *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  void *pvVar4;
  size_t i;
  ulong uVar5;
  INFO_DATATYPE type;
  size_t tmp_size;
  char tmp [1024];
  int local_44c;
  ulong local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  char local_438 [1032];
  
  local_440 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_440;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_44c = 0;
  memset(local_438,0,0x400);
  local_448 = 0x400;
  if (*(long *)(this + 0x80) == 0) {
    pIVar1 = *(Interface **)(this + 0x10);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    pvVar4 = Interface::getHandle(pIVar1);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (pvVar4 == (void *)0x0) {
      iVar3 = -0x3e9;
    }
    else {
      p_Var2 = (((obj->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
                 super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rport).
               super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      pIVar1 = *(Interface **)(this + 0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x18);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pvVar4 = Interface::getHandle(pIVar1);
      iVar3 = (*(code *)p_Var2)(pvVar4,*(undefined8 *)(this + 0x30),(ulong)gentl & 0xffffffff,
                                &local_44c,local_438,&local_448);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  else {
    iVar3 = (*(code *)(((obj->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
                        super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      eventadapter).
                      super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (*(long *)(this + 0x80),(ulong)gentl & 0xffffffff,&local_44c,local_438,
                       &local_448);
  }
  if (((iVar3 == 0) && (local_44c == 1)) && (local_448 != 0)) {
    uVar5 = 0;
    do {
      if (local_438[uVar5] == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_448);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cDevGetInfo(const Device *obj, const std::shared_ptr<const GenTLWrapper> &gentl,
                        GenTL::DEVICE_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (obj->getHandle() != 0)
  {
    err=gentl->DevGetInfo(obj->getHandle(), info, &type, tmp, &tmp_size);
  }
  else if (obj->getParent()->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(obj->getParent()->getHandle(), obj->getID().c_str(), info, &type,
                               tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}